

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMessageDefinitions
          (FileGenerator *this,Printer *printer)

{
  pointer ppMVar1;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppMVar1 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print(printer,"\n");
      ppMVar1 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    MessageGenerator::GenerateClassDefinition(ppMVar1[uVar2],printer);
  }
  return;
}

Assistant:

void FileGenerator::GenerateMessageDefinitions(io::Printer* printer) {
  // Generate class definitions.
  for (int i = 0; i < message_generators_.size(); i++) {
    if (i > 0) {
      printer->Print("\n");
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateClassDefinition(printer);
  }
}